

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

size_t __thiscall Potassco::StringBuilder::size(StringBuilder *this)

{
  StringBuilder *in_stack_00000010;
  undefined8 local_18;
  
  buffer(in_stack_00000010);
  return local_18;
}

Assistant:

std::size_t StringBuilder::size() const {
	return buffer().used;
}